

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

int Cbs_ManSolve(Cbs_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  s_Counter = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b7,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b8,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b9,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  (p->Pars).nBTThisNc = 0;
  Cbs_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  iVar5 = Cbs_ManSolve_rec(p,0);
  iVar8 = 1;
  if (((iVar5 == 0) && ((p->Pars).nJustThis <= (p->Pars).nJustLimit)) &&
     ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
    p_00 = p->vModel;
    iVar8 = 0;
    p_00->nSize = 0;
    (p->pProp).iHead = 0;
    if (0 < (p->pProp).iTail) {
      iVar8 = 0;
      lVar7 = 0;
      do {
        pGVar3 = (p->pProp).pData[lVar7];
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar4 = *(ulong *)pGVar3;
        if ((~(uint)uVar4 & 0x9fffffff) == 0) {
          if (((uint)uVar4 >> 0x1e & 1) == 0) {
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                          ,0x5d,"int Cbs_VarValue(Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,((uint)(uVar4 >> 0x1f) & 0x3ffffffe | (uint)(uVar4 >> 0x3e) & 1) ^ 1);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->pProp).iTail);
    }
  }
  iVar5 = (p->pProp).iTail;
  if (iVar5 < 0) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                  ,0x1e6,"void Cbs_ManCancelUntil(Cbs_Man_t *, int)");
  }
  (p->pProp).iHead = 0;
  if (iVar5 != 0) {
    lVar7 = 0;
    do {
      pGVar3 = (p->pProp).pData[lVar7];
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)pGVar3 >> 0x1e & 1) == 0) {
        __assert_fail("pVar->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat.c"
                      ,0x5c,"void Cbs_VarUnassign(Gia_Obj_t *)");
      }
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffbfffffff;
      pGVar3->Value = 0xffffffff;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->pProp).iTail);
  }
  (p->pProp).iTail = 0;
  if (p->vLevReas->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p->vLevReas->nSize = 0;
  (p->pJust).iHead = 0;
  (p->pJust).iTail = 0;
  (p->pClauses).iHead = 1;
  (p->pClauses).iTail = 1;
  iVar5 = (p->Pars).nBTThis;
  iVar2 = (p->Pars).nJustThis;
  piVar1 = &(p->Pars).nBTTotal;
  *piVar1 = *piVar1 + iVar5;
  iVar6 = (p->Pars).nJustTotal;
  if (iVar6 <= iVar2) {
    iVar6 = iVar2;
  }
  (p->Pars).nJustTotal = iVar6;
  iVar6 = -1;
  if ((iVar2 <= (p->Pars).nJustLimit) && (iVar6 = iVar8, (p->Pars).nBTLimit < iVar5)) {
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int Cbs_ManSolve( Cbs_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue = 0;
    s_Counter = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Cbs_ManSolve_rec(p, 0) && !Cbs_ManCheckLimits(p) )
        Cbs_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "%d ", s_Counter );
    return RetValue;
}